

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O2

ssize_t archive_write_shar_data_sed(archive_write *a,void *buff,size_t n)

{
  char cVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  archive_string *paVar5;
  size_t length;
  ulong length_00;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  
  sVar8 = 0;
  if ((n != 0) && (pvVar2 = a->format_data, *(int *)((long)pvVar2 + 0x10) != 0)) {
    paVar5 = archive_string_ensure((archive_string *)((long)pvVar2 + 0x60),0x10000);
    if (paVar5 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Out of memory");
LAB_004cdb33:
      sVar8 = 0xffffffffffffffe2;
    }
    else {
      length_00 = *(ulong *)((long)pvVar2 + 0x68);
      if (0xfffd < length_00) {
        iVar4 = __archive_write_output(a,((archive_string *)((long)pvVar2 + 0x60))->s,length_00);
        if (iVar4 != 0) {
          return -0x1e;
        }
        *(undefined8 *)((long)pvVar2 + 0x68) = 0;
        length_00 = 0;
      }
      lVar3 = *(long *)((long)pvVar2 + 0x60);
      pcVar6 = (char *)(length_00 + lVar3);
      if (*(int *)((long)pvVar2 + 4) != 0) {
        *pcVar6 = 'X';
        pcVar6 = pcVar6 + 1;
        *(undefined4 *)((long)pvVar2 + 4) = 0;
      }
      for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
        cVar1 = *(char *)((long)buff + sVar8);
        pcVar7 = pcVar6 + 1;
        *pcVar6 = cVar1;
        if (cVar1 == '\n') {
          if (n - 1 == sVar8) {
            *(undefined4 *)((long)pvVar2 + 4) = 1;
          }
          else {
            pcVar6[1] = 'X';
            pcVar7 = pcVar6 + 2;
          }
        }
        if ((char *)(lVar3 + 0xfffd) <= pcVar7) {
          length = (long)pcVar7 - (long)*(void **)((long)pvVar2 + 0x60);
          *(size_t *)((long)pvVar2 + 0x68) = length;
          iVar4 = __archive_write_output(a,*(void **)((long)pvVar2 + 0x60),length);
          if (iVar4 != 0) goto LAB_004cdb33;
          *(undefined8 *)((long)pvVar2 + 0x68) = 0;
          pcVar7 = *(char **)((long)pvVar2 + 0x60);
        }
        pcVar6 = pcVar7;
      }
      *(long *)((long)pvVar2 + 0x68) = (long)pcVar6 - *(long *)((long)pvVar2 + 0x60);
      sVar8 = n;
    }
  }
  return sVar8;
}

Assistant:

static ssize_t
archive_write_shar_data_sed(struct archive_write *a, const void *buff, size_t n)
{
	static const size_t ensured = 65533;
	struct shar *shar;
	const char *src;
	char *buf, *buf_end;
	int ret;
	size_t written = n;

	shar = (struct shar *)a->format_data;
	if (!shar->has_data || n == 0)
		return (0);

	src = (const char *)buff;

	/*
	 * ensure is the number of bytes in buffer before expanding the
	 * current character.  Each operation writes the current character
	 * and optionally the start-of-new-line marker.  This can happen
	 * twice before entering the loop, so make sure three additional
	 * bytes can be written.
	 */
	if (archive_string_ensure(&shar->work, ensured + 3) == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}

	if (shar->work.length > ensured) {
		ret = __archive_write_output(a, shar->work.s,
		    shar->work.length);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		archive_string_empty(&shar->work);
	}
	buf = shar->work.s + shar->work.length;
	buf_end = shar->work.s + ensured;

	if (shar->end_of_line) {
		*buf++ = 'X';
		shar->end_of_line = 0;
	}

	while (n-- != 0) {
		if ((*buf++ = *src++) == '\n') {
			if (n == 0)
				shar->end_of_line = 1;
			else
				*buf++ = 'X';
		}

		if (buf >= buf_end) {
			shar->work.length = buf - shar->work.s;
			ret = __archive_write_output(a, shar->work.s,
			    shar->work.length);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			archive_string_empty(&shar->work);
			buf = shar->work.s;
		}
	}

	shar->work.length = buf - shar->work.s;

	return (written);
}